

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_peek_bitset.hpp
# Opt level: O1

bool __thiscall
boost::xpressive::detail::hash_peek_bitset<char>::test_icase_
          (hash_peek_bitset<char> *this,bool icase)

{
  long lVar1;
  long lVar2;
  long lVar3;
  char cVar4;
  ushort uVar5;
  byte bVar16;
  char cVar17;
  byte bVar18;
  char cVar19;
  byte bVar20;
  char cVar21;
  byte bVar22;
  char cVar23;
  byte bVar24;
  undefined1 auVar14 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined4 uVar6;
  undefined6 uVar7;
  undefined8 uVar8;
  undefined1 auVar9 [12];
  undefined1 auVar10 [12];
  undefined1 auVar11 [14];
  undefined1 auVar12 [14];
  undefined1 auVar13 [16];
  undefined1 auVar15 [16];
  
  lVar1 = 1;
  lVar2 = 0;
  lVar3 = 0;
  do {
    auVar14 = *(undefined1 (*) [16])((this->bset_).super__Base_bitset<4UL>._M_w + lVar1 + -1);
    auVar25._0_2_ = auVar14._0_2_ >> 1;
    auVar25._2_2_ = auVar14._2_2_ >> 1;
    auVar25._4_2_ = auVar14._4_2_ >> 1;
    auVar25._6_2_ = auVar14._6_2_ >> 1;
    auVar25._8_2_ = auVar14._8_2_ >> 1;
    auVar25._10_2_ = auVar14._10_2_ >> 1;
    auVar25._12_2_ = auVar14._12_2_ >> 1;
    auVar25._14_2_ = auVar14._14_2_ >> 1;
    auVar25 = auVar25 & _DAT_0016b0f0;
    uVar5 = CONCAT11(auVar14[1] - auVar25[1],auVar14[0] - auVar25[0]);
    uVar6 = CONCAT13(auVar14[3] - auVar25[3],CONCAT12(auVar14[2] - auVar25[2],uVar5));
    uVar7 = CONCAT15(auVar14[5] - auVar25[5],CONCAT14(auVar14[4] - auVar25[4],uVar6));
    uVar8 = CONCAT17(auVar14[7] - auVar25[7],CONCAT16(auVar14[6] - auVar25[6],uVar7));
    auVar9._0_10_ = CONCAT19(auVar14[9] - auVar25[9],CONCAT18(auVar14[8] - auVar25[8],uVar8));
    auVar9[10] = auVar14[10] - auVar25[10];
    auVar9[0xb] = auVar14[0xb] - auVar25[0xb];
    auVar11[0xc] = auVar14[0xc] - auVar25[0xc];
    auVar11._0_12_ = auVar9;
    auVar11[0xd] = auVar14[0xd] - auVar25[0xd];
    auVar13[0xe] = auVar14[0xe] - auVar25[0xe];
    auVar13._0_14_ = auVar11;
    auVar13[0xf] = auVar14[0xf] - auVar25[0xf];
    auVar25 = auVar13 & _DAT_0016b100;
    auVar14._0_2_ = uVar5 >> 2;
    auVar14._2_2_ = (ushort)((uint)uVar6 >> 0x12);
    auVar14._4_2_ = (ushort)((uint6)uVar7 >> 0x22);
    auVar14._6_2_ = (ushort)((ulong)uVar8 >> 0x32);
    auVar14._8_2_ = (ushort)((unkuint10)auVar9._0_10_ >> 0x42);
    auVar14._10_2_ = auVar9._10_2_ >> 2;
    auVar14._12_2_ = auVar11._12_2_ >> 2;
    auVar14._14_2_ = auVar13._14_2_ >> 2;
    auVar14 = auVar14 & _DAT_0016b100;
    cVar4 = auVar14[0] + auVar25[0];
    bVar16 = auVar14[1] + auVar25[1];
    uVar5 = CONCAT11(bVar16,cVar4);
    cVar17 = auVar14[2] + auVar25[2];
    bVar18 = auVar14[3] + auVar25[3];
    uVar6 = CONCAT13(bVar18,CONCAT12(cVar17,uVar5));
    cVar19 = auVar14[4] + auVar25[4];
    bVar20 = auVar14[5] + auVar25[5];
    uVar7 = CONCAT15(bVar20,CONCAT14(cVar19,uVar6));
    cVar21 = auVar14[6] + auVar25[6];
    bVar22 = auVar14[7] + auVar25[7];
    uVar8 = CONCAT17(bVar22,CONCAT16(cVar21,uVar7));
    cVar23 = auVar14[8] + auVar25[8];
    bVar24 = auVar14[9] + auVar25[9];
    auVar10._0_10_ = CONCAT19(bVar24,CONCAT18(cVar23,uVar8));
    auVar10[10] = auVar14[10] + auVar25[10];
    auVar10[0xb] = auVar14[0xb] + auVar25[0xb];
    auVar12[0xc] = auVar14[0xc] + auVar25[0xc];
    auVar12._0_12_ = auVar10;
    auVar12[0xd] = auVar14[0xd] + auVar25[0xd];
    auVar15[0xe] = auVar14[0xe] + auVar25[0xe];
    auVar15._0_14_ = auVar12;
    auVar15[0xf] = auVar14[0xf] + auVar25[0xf];
    auVar26[0] = (char)(uVar5 >> 4) + cVar4;
    auVar26[1] = (bVar16 >> 4) + bVar16;
    auVar26[2] = (char)(ushort)((uint)uVar6 >> 0x14) + cVar17;
    auVar26[3] = (bVar18 >> 4) + bVar18;
    auVar26[4] = (char)(ushort)((uint6)uVar7 >> 0x24) + cVar19;
    auVar26[5] = (bVar20 >> 4) + bVar20;
    auVar26[6] = (char)(ushort)((ulong)uVar8 >> 0x34) + cVar21;
    auVar26[7] = (bVar22 >> 4) + bVar22;
    auVar26[8] = (char)(ushort)((unkuint10)auVar10._0_10_ >> 0x44) + cVar23;
    auVar26[9] = (bVar24 >> 4) + bVar24;
    auVar26[10] = (char)(auVar10._10_2_ >> 4) + auVar10[10];
    auVar26[0xb] = (auVar10[0xb] >> 4) + auVar10[0xb];
    auVar26[0xc] = (char)(auVar12._12_2_ >> 4) + auVar12[0xc];
    auVar26[0xd] = (auVar12[0xd] >> 4) + auVar12[0xd];
    auVar26[0xe] = (char)(auVar15._14_2_ >> 4) + auVar15[0xe];
    auVar26[0xf] = (auVar15[0xf] >> 4) + auVar15[0xf];
    auVar14 = psadbw(auVar26 & _DAT_0016b110,(undefined1  [16])0x0);
    lVar2 = lVar2 + auVar14._0_8_;
    lVar3 = lVar3 + auVar14._8_8_;
    lVar1 = lVar1 + 2;
  } while (lVar1 != 5);
  if (lVar3 + lVar2 != 0) {
    if (lVar3 + lVar2 != 0x100) {
      if (this->icase_ == icase) goto LAB_0012cd18;
      this->icase_ = false;
      *(undefined4 *)((this->bset_).super__Base_bitset<4UL>._M_w + 2) = 0xffffffff;
      *(undefined4 *)((long)(this->bset_).super__Base_bitset<4UL>._M_w + 0x14) = 0xffffffff;
      *(undefined4 *)((this->bset_).super__Base_bitset<4UL>._M_w + 3) = 0xffffffff;
      *(undefined4 *)((long)(this->bset_).super__Base_bitset<4UL>._M_w + 0x1c) = 0xffffffff;
      *(undefined4 *)(this->bset_).super__Base_bitset<4UL>._M_w = 0xffffffff;
      *(undefined4 *)((long)(this->bset_).super__Base_bitset<4UL>._M_w + 4) = 0xffffffff;
      *(undefined4 *)((this->bset_).super__Base_bitset<4UL>._M_w + 1) = 0xffffffff;
      *(undefined4 *)((long)(this->bset_).super__Base_bitset<4UL>._M_w + 0xc) = 0xffffffff;
    }
    return false;
  }
LAB_0012cd18:
  this->icase_ = icase;
  return true;
}

Assistant:

bool test_icase_(bool icase)
    {
        std::size_t count = this->bset_.count();

        if(256 == count)
        {
            return false; // all set already, nothing to do
        }
        else if(0 != count && this->icase_ != icase)
        {
            this->set_all(); // icase mismatch! set all and bail
            return false;
        }

        this->icase_ = icase;
        return true;
    }